

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::generate_mipmaps
          (mipmapped_texture *this,generate_mipmap_params *params,bool force)

{
  bool bVar1;
  uint uVar2;
  mip_level *pmVar3;
  image_u8 *other;
  image_u8 *this_00;
  uint uVar4;
  uint f;
  ulong uVar5;
  uint size;
  image_u8 *p;
  uint uVar6;
  uint l;
  ulong uVar7;
  uint l_1;
  bool bVar8;
  face_vec faces;
  resample_params local_a0;
  ulong local_78;
  long local_70;
  image_u8 tmp;
  
  size = (this->m_faces).m_size;
  if (size == 0) {
    bVar8 = false;
  }
  else {
    uVar4 = this->m_width;
    uVar2 = 1;
    for (uVar6 = this->m_height;
        (params->m_min_mip_size < uVar4 || (params->m_min_mip_size < uVar6)); uVar6 = uVar6 >> 1) {
      uVar4 = uVar4 >> 1;
      uVar2 = uVar2 + 1;
    }
    uVar4 = params->m_max_mips;
    uVar6 = uVar4;
    if (uVar2 < uVar4) {
      uVar6 = uVar2;
    }
    if (uVar4 == 0) {
      uVar6 = uVar2;
    }
    if ((force) && (1 < ((this->m_faces).m_p)->m_size)) {
      discard_mipmaps(this);
      size = (this->m_faces).m_size;
    }
    if (size == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = ((this->m_faces).m_p)->m_size;
    }
    bVar8 = true;
    if (uVar6 != uVar4) {
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&faces,size);
      for (uVar5 = 0; uVar7 = (ulong)faces.m_size, uVar5 < uVar7; uVar5 = uVar5 + 1) {
        vector<crnlib::mip_level_*>::resize(faces.m_p + uVar5,uVar6,false);
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          pmVar3 = crnlib_new<crnlib::mip_level>();
          faces.m_p[uVar5].m_p[uVar7] = pmVar3;
        }
      }
      uVar5 = 0;
      while (bVar8 = uVar7 <= uVar5, !bVar8) {
        tmp.m_width = 0;
        tmp.m_height = 0;
        tmp.m_pitch = 0;
        tmp.m_total = 0;
        tmp.m_comp_flags = 0xf;
        tmp.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        tmp.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        tmp.m_pixel_buf.m_size = 0;
        tmp.m_pixel_buf.m_capacity = 0;
        local_70 = uVar5 * 0x10;
        pmVar3 = *(this->m_faces).m_p[uVar5].m_p;
        local_78 = uVar5;
        other = mip_level::get_unpacked_image(pmVar3,&tmp,1);
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          uVar2 = this->m_width >> ((byte)uVar5 & 0x1f);
          uVar4 = this->m_height >> ((byte)uVar5 & 0x1f);
          this_00 = (image_u8 *)
                    crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                              ((crnlib *)pmVar3);
          if (uVar5 != 0) {
            local_a0.m_filter_scale = (params->super_resample_params).m_filter_scale;
            local_a0.m_first_comp = 0;
            local_a0.m_source_gamma = 2.2;
            local_a0.m_num_comps = 4 - ((other->m_comp_flags & 8) == 0);
            local_a0.m_wrapping = (params->super_resample_params).m_wrapping;
            local_a0.m_srgb = (params->super_resample_params).m_srgb;
            local_a0.m_pFilter = (params->super_resample_params).m_pFilter;
            local_a0.m_multithreaded = (params->super_resample_params).m_multithreaded;
            p = this_00;
            local_a0.m_dst_width = uVar2 + (uVar2 == 0);
            local_a0.m_dst_height = uVar4 + (uVar4 == 0);
            bVar1 = image_utils::resample(other,this_00,&local_a0);
            if (bVar1) {
              if ((params->super_resample_params).m_renormalize == true) {
                image_utils::renorm_normal_map(this_00);
              }
              this_00->m_comp_flags = other->m_comp_flags;
              goto LAB_00133e31;
            }
            crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this_00,p)
            ;
            for (uVar5 = 0; uVar5 < faces.m_size; uVar5 = uVar5 + 1) {
              for (uVar7 = 0; uVar7 < faces.m_p[uVar5].m_size; uVar7 = uVar7 + 1) {
                crnlib_delete<crnlib::mip_level>(faces.m_p[uVar5].m_p[uVar7]);
              }
            }
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp.m_pixel_buf);
            goto LAB_00133ee0;
          }
          image<crnlib::color_quad<unsigned_char,_int>_>::operator=(this_00,other);
LAB_00133e31:
          pmVar3 = *(mip_level **)(*(long *)((long)&(faces.m_p)->m_p + local_70) + uVar5 * 8);
          mip_level::assign(pmVar3,this_00,PIXEL_FMT_INVALID,
                            *(orientation_flags_t *)
                             (**(long **)((long)&((this->m_faces).m_p)->m_p + local_70) + 0x20));
        }
        vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp.m_pixel_buf);
        uVar5 = local_78 + 1;
        uVar7 = (ulong)faces.m_size;
      }
      assign(this,&faces);
LAB_00133ee0:
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
    }
  }
  return bVar8;
}

Assistant:

bool mipmapped_texture::generate_mipmaps(const generate_mipmap_params& params, bool force) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  uint num_levels = 1;
  {
    uint width = get_width();
    uint height = get_height();
    while ((width > params.m_min_mip_size) || (height > params.m_min_mip_size)) {
      width >>= 1U;
      height >>= 1U;
      num_levels++;
    }
  }

  if ((params.m_max_mips > 0) && (num_levels > params.m_max_mips))
    num_levels = params.m_max_mips;

  if ((force) && (get_num_levels() > 1))
    discard_mipmaps();

  if (num_levels == get_num_levels())
    return true;

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(num_levels);
    for (uint l = 0; l < num_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    for (uint l = 0; l < num_levels; l++) {
      const uint mip_width = math::maximum<uint>(1U, get_width() >> l);
      const uint mip_height = math::maximum<uint>(1U, get_height() >> l);

      image_u8* pMip = crnlib_new<image_u8>();

      if (!l)
        *pMip = *pImg;
      else {
        image_utils::resample_params rparams;
        rparams.m_dst_width = mip_width;
        rparams.m_dst_height = mip_height;
        rparams.m_filter_scale = params.m_filter_scale;
        rparams.m_first_comp = 0;
        rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
        rparams.m_srgb = params.m_srgb;
        rparams.m_wrapping = params.m_wrapping;
        rparams.m_pFilter = params.m_pFilter;
        rparams.m_multithreaded = params.m_multithreaded;

        if (!image_utils::resample(*pImg, *pMip, rparams)) {
          crnlib_delete(pMip);

          for (uint f = 0; f < faces.size(); f++)
            for (uint l = 0; l < faces[f].size(); l++)
              crnlib_delete(faces[f][l]);

          return false;
        }

        if (params.m_renormalize)
          image_utils::renorm_normal_map(*pMip);

        pMip->set_comp_flags(pImg->get_comp_flags());
      }

      faces[f][l]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
    }
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}